

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase130::run(TestCase130 *this)

{
  size_t in_RSI;
  Array<kj::(anonymous_namespace)::TestObject> AStack_6a8;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  NullableValue<kj::Exception> local_4d8;
  NullableValue<kj::Exception> local_340;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  heapArray<kj::(anonymous_namespace)::TestObject>(&AStack_6a8,in_RSI);
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&AStack_6a8);
  local_4d8.isSet = false;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&local_340,(Maybe<kj::Exception> *)&local_4d8)
  ;
  _::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition,(DebugExpression<kj::Maybe<kj::Exception>> *)&local_340,(None *)&none);
  _::NullableValue<kj::Exception>::~NullableValue(&local_340);
  _::NullableValue<kj::Exception>::~NullableValue(&local_4d8);
  if ((_kjCondition.result == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none\", _kjCondition"
               ,(char (*) [95])
                "failed: expected ::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none"
               ,&_kjCondition);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  _kjCondition.left.ptr.isSet = false;
  _kjCondition.left.ptr._1_3_ = 0;
  _kjCondition.left.ptr.field_1._24_1_ = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition.left.ptr.field_1.value.ownFile.content.ptr =
       (char *)&(anonymous_namespace)::TestObject::count;
  _kjCondition.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_1b07e;
  _kjCondition.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x5;
  if ((!(bool)_kjCondition.left.ptr.field_1._24_1_) && (_::Debug::minSeverity < 3)) {
    local_340.isSet = false;
    local_340._1_3_ = 0;
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&local_340,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(Array, ThrowingConstructor) {
  TestObject::count = 0;
  TestObject::throwAt = 16;

  // If a constructor throws, the previous elements should still be destroyed.
  EXPECT_ANY_THROW(heapArray<TestObject>(32));
  EXPECT_EQ(0, TestObject::count);
}